

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlBufPtr xmlBufCreate(void)

{
  uint uVar1;
  xmlBufPtr pxVar2;
  uint *puVar3;
  xmlBufferAllocationScheme *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  ulong uVar7;
  
  pxVar2 = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (pxVar2 == (xmlBufPtr)0x0) {
    pxVar2 = (xmlBufPtr)0x0;
    __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
  }
  else {
    pxVar2->use = 0;
    pxVar2->error = 0;
    pxVar2->buffer = (xmlBufferPtr)0x0;
    puVar3 = (uint *)__xmlDefaultBufferSize();
    uVar1 = *puVar3;
    uVar6 = 0x7fffffff;
    if (uVar1 < 0x7fffffff) {
      uVar6 = uVar1;
    }
    pxVar2->size = (long)(int)uVar1;
    pxVar2->compat_size = uVar6;
    uVar7 = 0x7fffffff;
    if (pxVar2->use < 0x7fffffff) {
      uVar7 = pxVar2->use;
    }
    pxVar2->compat_use = (uint)uVar7;
    pxVar4 = __xmlBufferAllocScheme();
    pxVar2->alloc = *pxVar4;
    pxVar5 = (xmlChar *)(*xmlMallocAtomic)(pxVar2->size);
    pxVar2->content = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) {
      __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
      if (pxVar2->error == 0) {
        pxVar2->error = 2;
      }
      (*xmlFree)(pxVar2);
      pxVar2 = (xmlBufPtr)0x0;
    }
    else {
      *pxVar5 = '\0';
      pxVar2->contentIO = (xmlChar *)0x0;
    }
  }
  return pxVar2;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    UPDATE_COMPAT(ret);
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}